

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsMessageSetData(HelicsMessage message,void *data,int inputDataLength,HelicsError *err)

{
  Message *pMVar1;
  int in_EDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  SmallBuffer *in_RDI;
  Message *mess;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsMessage in_stack_ffffffffffffffd8;
  
  pMVar1 = getMessageObj(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pMVar1 != (Message *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffc8,
               (char *)in_RSI,(long)in_EDX);
    helics::SmallBuffer::operator=(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void helicsMessageSetData(HelicsMessage message, const void* data, int inputDataLength, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    mess->data = std::string_view(static_cast<const char*>(data), inputDataLength);
}